

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_convolve_2d_sr_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  ushort uVar1;
  ushort uVar2;
  int16_t *piVar3;
  byte bVar4;
  uint8_t uVar5;
  int x;
  int iVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  short *psVar21;
  short *psVar22;
  short *psVar23;
  short asStack_8b38 [17796];
  
  uVar1 = filter_params_y->taps;
  iVar13 = (uVar1 >> 1) - 1;
  uVar2 = filter_params_x->taps;
  piVar3 = filter_params_x->filter_ptr;
  iVar7 = conv_params->round_1;
  bVar4 = (byte)conv_params->round_0;
  uVar15 = 0;
  if (0 < w) {
    uVar15 = (ulong)(uint)w;
  }
  uVar16 = 0;
  uVar18 = (h + (uint)uVar1) - 1;
  uVar12 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar12 = uVar16;
  }
  iVar6 = 1 - (uint)(uVar2 >> 1);
  lVar17 = (long)w;
  for (; uVar16 != uVar12; uVar16 = uVar16 + 1) {
    iVar14 = iVar6;
    for (uVar8 = 0; uVar8 != uVar15; uVar8 = uVar8 + 1) {
      iVar20 = 0x4000;
      for (uVar19 = 0; uVar2 != uVar19; uVar19 = uVar19 + 1) {
        iVar20 = iVar20 + (uint)src[uVar19 + ((long)iVar14 - (long)(iVar13 * src_stride))] *
                          (int)*(short *)((long)piVar3 +
                                         uVar19 * 2 +
                                         (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
      }
      asStack_8b38[uVar8 + uVar16 * lVar17] =
           (short)(iVar20 + ((1 << (bVar4 & 0x1f)) >> 1) >> (bVar4 & 0x1f));
      iVar14 = iVar14 + 1;
    }
    iVar6 = iVar6 + src_stride;
  }
  bVar9 = 0xe - ((char)iVar7 + bVar4);
  piVar3 = filter_params_y->filter_ptr;
  uVar12 = (ulong)(uint)h;
  if (h < 1) {
    uVar12 = 0;
  }
  psVar22 = asStack_8b38 + (1 - (ulong)(uVar1 >> 1)) * lVar17 + (long)(iVar13 * w);
  for (uVar16 = 0; uVar16 != uVar12; uVar16 = uVar16 + 1) {
    psVar23 = psVar22;
    for (uVar8 = 0; uVar8 != uVar15; uVar8 = uVar8 + 1) {
      psVar21 = psVar23;
      iVar7 = 1 << (0x16 - bVar4 & 0x1f);
      for (uVar19 = 0; filter_params_y->taps != uVar19; uVar19 = uVar19 + 1) {
        iVar7 = iVar7 + (int)*psVar21 *
                        (int)*(short *)((long)piVar3 +
                                       uVar19 * 2 + (ulong)((subpel_y_qn & 0xfU) * (uint)uVar1 * 2))
        ;
        psVar21 = psVar21 + lVar17;
      }
      bVar10 = (byte)conv_params->round_1;
      bVar11 = (0x16 - bVar4) - bVar10;
      iVar7 = (int)(short)((short)(-1 << (bVar11 - 1 & 0x1f)) + (short)(-1 << (bVar11 & 0x1f)) +
                          (short)(((1 << (bVar10 & 0x1f)) >> 1) + iVar7 >> (bVar10 & 0x1f))) +
              ((1 << (bVar9 & 0x1f)) >> 1) >> (bVar9 & 0x1f);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar5 = (uint8_t)iVar7;
      if (0xfe < iVar7) {
        uVar5 = 0xff;
      }
      dst[uVar8 + uVar16 * (long)dst_stride] = uVar5;
      psVar23 = psVar23 + 1;
    }
    psVar22 = psVar22 + lVar17;
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_c(const uint8_t *src, int src_stride, uint8_t *dst,
                          int dst_stride, int w, int h,
                          const InterpFilterParams *filter_params_x,
                          const InterpFilterParams *filter_params_y,
                          const int subpel_x_qn, const int subpel_y_qn,
                          ConvolveParams *conv_params) {
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bd = 8;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;

  // horizontal filter
  const uint8_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }

      // TODO(aomedia:3393): for 12-tap filter, in extreme cases, the result can
      // be beyond the following range. For better prediction, a clamping can be
      // added for 12 tap filter to ensure the horizontal filtering result is
      // within 16 bit. The same applies to the vertical filtering.
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      int16_t res = ROUND_POWER_OF_TWO(sum, conv_params->round_1) -
                    ((1 << (offset_bits - conv_params->round_1)) +
                     (1 << (offset_bits - conv_params->round_1 - 1)));
      dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(res, bits));
    }
  }
}